

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O0

void __thiscall Image_ExrIO_Test::TestBody(Image_ExrIO_Test *this)

{
  PixelFormat format_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_01;
  WrapMode2D wrapMode;
  WrapMode2D wrapMode_00;
  WrapMode2D wrapMode_01;
  WrapMode2D wrapMode_02;
  WrapMode2D wrapMode_03;
  Point2i p;
  Point2i p_00;
  Point2i p_01;
  Point2i p_02;
  Point2i p_03;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_float> buf;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  bool bVar1;
  const_iterator pPVar2;
  reference pvVar3;
  int *piVar4;
  reference pvVar5;
  char *pcVar6;
  Float ff;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  int c_1;
  ImageChannelValues v;
  int x_1;
  int y_1;
  AssertionResult gtest_ar__1;
  ImageChannelDesc rgbDesc;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  ImageAndMetadata read;
  AssertionResult gtest_ar_;
  ImageMetadata metadata;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int c;
  int x;
  int y;
  int offset;
  Image image;
  PixelFormat format;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<pbrt::PixelFormat> *__range1;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> rgbPixels;
  Point2i res;
  ImageMetadata *in_stack_fffffffffffff418;
  int iVar7;
  ImageAndMetadata *in_stack_fffffffffffff420;
  undefined4 in_stack_fffffffffffff428;
  WrapMode in_stack_fffffffffffff42c;
  undefined7 in_stack_fffffffffffff430;
  undefined1 in_stack_fffffffffffff437;
  char *in_stack_fffffffffffff438;
  Message *in_stack_fffffffffffff440;
  Message *in_stack_fffffffffffff448;
  allocator<char> *in_stack_fffffffffffff450;
  Message *in_stack_fffffffffffff458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff460;
  reference in_stack_fffffffffffff480;
  Float in_stack_fffffffffffff488;
  int in_stack_fffffffffffff48c;
  char *in_stack_fffffffffffff490;
  undefined7 in_stack_fffffffffffff498;
  undefined1 in_stack_fffffffffffff49f;
  undefined4 in_stack_fffffffffffff4a0;
  WrapMode in_stack_fffffffffffff4a4;
  float in_stack_fffffffffffff4a8;
  Float in_stack_fffffffffffff4ac;
  int in_stack_fffffffffffff4b0;
  int in_stack_fffffffffffff4b4;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffff4b8;
  undefined4 in_stack_fffffffffffff4f8;
  int in_stack_fffffffffffff4fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff500;
  size_t in_stack_fffffffffffff508;
  undefined6 in_stack_fffffffffffff530;
  undefined1 in_stack_fffffffffffff536;
  undefined1 in_stack_fffffffffffff537;
  Image *in_stack_fffffffffffff538;
  Image *in_stack_fffffffffffff540;
  Allocator in_stack_fffffffffffff548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff550;
  allocator<char> *in_stack_fffffffffffff558;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffff560;
  Image *desc;
  Image *this_00;
  array<pbrt::WrapMode,_2> wrapMode_04;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffff588;
  string *local_990;
  AssertionResult local_938 [3];
  Float local_904;
  AssertionResult local_900 [3];
  Half local_8ce;
  float local_8cc;
  AssertionResult local_8c8 [3];
  Half local_896;
  float local_894;
  AssertionResult local_890;
  int local_87c;
  int local_838;
  int local_834;
  string local_830 [48];
  AssertionResult local_800;
  undefined1 local_7ec;
  allocator<char> local_7eb;
  allocator<char> local_7ea;
  allocator<char> local_7e9;
  Tuple2<pbrt::Point2,_int> local_7e8;
  undefined1 local_7e0 [96];
  undefined1 local_780 [136];
  AssertionResult local_6f8 [2];
  Tuple2<pbrt::Point2,_int> local_6d8;
  Tuple2<pbrt::Point2,_int> local_6d0;
  AssertionResult local_6c8 [2];
  allocator<char> local_6a1;
  string local_6a0 [32];
  Image local_680;
  string local_468 [55];
  allocator<char> local_431;
  string local_430 [32];
  AssertionResult local_410 [9];
  ImageMetadata *in_stack_fffffffffffffc80;
  string *in_stack_fffffffffffffc88;
  Image *in_stack_fffffffffffffc90;
  AssertionResult local_2d8;
  uint local_2c4;
  Float local_29c;
  Half local_296;
  float local_294;
  AssertionResult local_290;
  int local_280;
  int local_27c;
  int local_278;
  int local_274;
  ImageMetadata *local_248;
  undefined1 local_237;
  allocator<char> local_236;
  allocator<char> local_235 [20];
  allocator<char> local_221;
  string *local_220;
  string local_218 [32];
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  string *local_1b8;
  undefined8 local_1b0;
  undefined8 in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  PixelFormat *local_68;
  PixelFormat local_5c;
  undefined4 local_58;
  undefined4 local_54;
  initializer_list<pbrt::PixelFormat> local_50;
  initializer_list<pbrt::PixelFormat> *local_40;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_30;
  Tuple2<pbrt::Point2,_int> local_10 [2];
  
  pbrt::Point2<int>::Point2
            ((Point2<int> *)in_stack_fffffffffffff420,
             (int)((ulong)in_stack_fffffffffffff418 >> 0x20),(int)in_stack_fffffffffffff418);
  GetFloatPixels((Point2i)in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b4);
  local_5c = U256;
  local_58 = 1;
  local_54 = 2;
  local_50._M_array = &local_5c;
  local_50._M_len = 3;
  local_40 = &local_50;
  local_68 = std::initializer_list<pbrt::PixelFormat>::begin(local_40);
  pPVar2 = std::initializer_list<pbrt::PixelFormat>::end
                     ((initializer_list<pbrt::PixelFormat> *)in_stack_fffffffffffff420);
  for (; local_68 != pPVar2; local_68 = local_68 + 1) {
    format_00 = *local_68;
    local_237 = 1;
    local_220 = local_218;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff460,(char *)in_stack_fffffffffffff458,in_stack_fffffffffffff450
              );
    local_220 = (string *)local_1f8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff460,(char *)in_stack_fffffffffffff458,in_stack_fffffffffffff450
              );
    local_220 = (string *)local_1d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff460,(char *)in_stack_fffffffffffff458,in_stack_fffffffffffff450
              );
    local_237 = 0;
    local_1b8 = local_218;
    local_1b0 = 3;
    v_00._M_array._4_4_ = in_stack_fffffffffffff42c;
    v_00._M_array._0_4_ = in_stack_fffffffffffff428;
    v_00._M_len._0_7_ = in_stack_fffffffffffff430;
    v_00._M_len._7_1_ = in_stack_fffffffffffff437;
    pstd::
    span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffff420,v_00);
    pbrt::ColorEncodingHandle::ColorEncodingHandle
              ((ColorEncodingHandle *)in_stack_fffffffffffff420,
               (ColorEncodingHandle *)in_stack_fffffffffffff418);
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff420);
    channels.n = (size_t)in_stack_fffffffffffff558;
    channels.ptr = in_stack_fffffffffffff550;
    in_stack_fffffffffffff418 = local_248;
    pbrt::Image::Image(in_stack_fffffffffffff540,
                       (PixelFormat)((ulong)in_stack_fffffffffffff538 >> 0x20),
                       (Point2i)in_stack_fffffffffffff560,channels,
                       (ColorEncodingHandle *)
                       CONCAT17(in_stack_fffffffffffff537,
                                CONCAT16(in_stack_fffffffffffff536,in_stack_fffffffffffff530)),
                       in_stack_fffffffffffff548);
    local_990 = (string *)&local_1b8;
    do {
      local_990 = local_990 + -0x20;
      std::__cxx11::string::~string(local_990);
    } while (local_990 != local_218);
    std::allocator<char>::~allocator(&local_236);
    std::allocator<char>::~allocator(local_235);
    std::allocator<char>::~allocator(&local_221);
    pbrt::Point2<int>::Point2
              ((Point2<int> *)in_stack_fffffffffffff420,
               (int)((ulong)in_stack_fffffffffffff418 >> 0x20),(int)in_stack_fffffffffffff418);
    pbrt::Bounds2<int>::Bounds2
              ((Bounds2<int> *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430),
               (Point2<int> *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428),
               (Point2<int> *)in_stack_fffffffffffff420);
    pstd::span<float_const>::
    span<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>,void,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>
              ((span<const_float> *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430),
               (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
    buf.n = (size_t)in_stack_fffffffffffff548.memoryResource;
    buf.ptr = (float *)in_stack_fffffffffffff540;
    pbrt::Image::CopyRectIn
              (in_stack_fffffffffffff538,
               (Bounds2i *)
               CONCAT17(in_stack_fffffffffffff537,
                        CONCAT16(in_stack_fffffffffffff536,in_stack_fffffffffffff530)),buf);
    local_274 = 0;
    for (local_278 = 0; local_278 < local_10[0].y; local_278 = local_278 + 1) {
      for (local_27c = 0; local_27c < local_10[0].x; local_27c = local_27c + 1) {
        for (local_280 = 0; local_280 < 3; local_280 = local_280 + 1) {
          if (format_00 != U256) {
            if (format_00 == Half) {
              pvVar3 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                                 (&local_30,(long)local_274);
              pbrt::Half::Half(&local_296,*pvVar3);
              local_294 = pbrt::Half::operator_cast_to_float(&local_296);
              pbrt::Point2<int>::Point2
                        ((Point2<int> *)in_stack_fffffffffffff420,
                         (int)((ulong)in_stack_fffffffffffff418 >> 0x20),
                         (int)in_stack_fffffffffffff418);
              pbrt::WrapMode2D::WrapMode2D
                        ((WrapMode2D *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430)
                         ,in_stack_fffffffffffff42c);
              p.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff4b0;
              p.super_Tuple2<pbrt::Point2,_int>.x = (int)in_stack_fffffffffffff4ac;
              wrapMode.wrap.values[1] = (WrapMode)in_stack_fffffffffffff4a8;
              wrapMode.wrap.values[0] = in_stack_fffffffffffff4a4;
              local_29c = pbrt::Image::GetChannel
                                    ((Image *)CONCAT17(in_stack_fffffffffffff49f,
                                                       in_stack_fffffffffffff498),p,
                                     (int)((ulong)in_stack_fffffffffffff490 >> 0x20),wrapMode);
              testing::internal::EqHelper<false>::Compare<float,float>
                        (in_stack_fffffffffffff438,
                         (char *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430),
                         (float *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428),
                         (float *)in_stack_fffffffffffff420);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_290);
              if (!bVar1) {
                testing::Message::Message((Message *)in_stack_fffffffffffff450);
                testing::AssertionResult::failure_message((AssertionResult *)0x5c432d);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)in_stack_fffffffffffff450,
                           (Type)((ulong)in_stack_fffffffffffff448 >> 0x20),
                           (char *)in_stack_fffffffffffff440,
                           (int)((ulong)in_stack_fffffffffffff438 >> 0x20),
                           (char *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)
                           CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                           (Message *)CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498))
                ;
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)in_stack_fffffffffffff420);
                testing::Message::~Message((Message *)0x5c4390);
              }
              local_2c4 = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c43fb);
            }
            else {
              if (format_00 != Float) goto LAB_005c4651;
              pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                        (&local_30,(long)local_274);
              pbrt::Point2<int>::Point2
                        ((Point2<int> *)in_stack_fffffffffffff420,
                         (int)((ulong)in_stack_fffffffffffff418 >> 0x20),
                         (int)in_stack_fffffffffffff418);
              pbrt::WrapMode2D::WrapMode2D
                        ((WrapMode2D *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430)
                         ,in_stack_fffffffffffff42c);
              p_00.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff4b0;
              p_00.super_Tuple2<pbrt::Point2,_int>.x = (int)in_stack_fffffffffffff4ac;
              wrapMode_00.wrap.values[1] = (WrapMode)in_stack_fffffffffffff4a8;
              wrapMode_00.wrap.values[0] = in_stack_fffffffffffff4a4;
              pbrt::Image::GetChannel
                        ((Image *)CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498),p_00
                         ,(int)((ulong)in_stack_fffffffffffff490 >> 0x20),wrapMode_00);
              testing::internal::EqHelper<false>::Compare<float,float>
                        (in_stack_fffffffffffff438,
                         (char *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430),
                         (float *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428),
                         (float *)in_stack_fffffffffffff420);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2d8);
              if (!bVar1) {
                testing::Message::Message((Message *)in_stack_fffffffffffff450);
                testing::AssertionResult::failure_message((AssertionResult *)0x5c455a);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)in_stack_fffffffffffff450,
                           (Type)((ulong)in_stack_fffffffffffff448 >> 0x20),
                           (char *)in_stack_fffffffffffff440,
                           (int)((ulong)in_stack_fffffffffffff438 >> 0x20),
                           (char *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)
                           CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                           (Message *)CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498))
                ;
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)in_stack_fffffffffffff420);
                testing::Message::~Message((Message *)0x5c45bd);
              }
              local_2c4 = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c4628);
            }
            if (local_2c4 != 0) goto LAB_005c5e37;
          }
LAB_005c4651:
          local_274 = local_274 + 1;
        }
      }
    }
    pbrt::ImageMetadata::ImageMetadata((ImageMetadata *)in_stack_fffffffffffff420);
    pstd::optional<const_pbrt::RGBColorSpace_*>::operator=
              ((optional<const_pbrt::RGBColorSpace_*> *)in_stack_fffffffffffff420,
               (RGBColorSpace **)in_stack_fffffffffffff418);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff460,(char *)in_stack_fffffffffffff458,in_stack_fffffffffffff450
              );
    pbrt::Image::Write(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80
                      );
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)in_stack_fffffffffffff420,
               SUB81((ulong)in_stack_fffffffffffff418 >> 0x38,0));
    std::__cxx11::string::~string(local_430);
    std::allocator<char>::~allocator(&local_431);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_410);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff450);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498),
                 in_stack_fffffffffffff490,
                 (char *)CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488),
                 (char *)in_stack_fffffffffffff480);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff450,
                 (Type)((ulong)in_stack_fffffffffffff448 >> 0x20),(char *)in_stack_fffffffffffff440,
                 (int)((ulong)in_stack_fffffffffffff438 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                 (Message *)CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff420);
      std::__cxx11::string::~string(local_468);
      testing::Message::~Message((Message *)0x5c48ab);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c4926);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff460,(char *)in_stack_fffffffffffff458,in_stack_fffffffffffff450
              );
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff420);
    pbrt::ColorEncodingHandle::TaggedPointer
              ((ColorEncodingHandle *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
    pbrt::Image::Read((string *)in_stack_fffffffffffffec0,(Allocator)in_stack_fffffffffffffec8,
                      (ColorEncodingHandle *)in_stack_fffffffffffffeb8);
    std::__cxx11::string::~string(local_6a0);
    std::allocator<char>::~allocator(&local_6a1);
    local_6d0 = (Tuple2<pbrt::Point2,_int>)
                pbrt::Image::Resolution((Image *)&stack0xfffffffffffffe70);
    local_6d8 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(&local_680);
    testing::internal::EqHelper<false>::Compare<pbrt::Point2<int>,pbrt::Point2<int>>
              (in_stack_fffffffffffff438,
               (char *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430),
               (Point2<int> *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428),
               (Point2<int> *)in_stack_fffffffffffff420);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6c8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff450);
      testing::AssertionResult::failure_message((AssertionResult *)0x5c4b09);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff450,
                 (Type)((ulong)in_stack_fffffffffffff448 >> 0x20),(char *)in_stack_fffffffffffff440,
                 (int)((ulong)in_stack_fffffffffffff438 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                 (Message *)CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff420);
      testing::Message::~Message((Message *)0x5c4b6c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c4bc4);
    pbrt::ImageMetadata::GetColorSpace(in_stack_fffffffffffff418);
    testing::internal::EqHelper<false>::Compare<pbrt::RGBColorSpace,pbrt::RGBColorSpace>
              (in_stack_fffffffffffff438,
               (char *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430),
               (RGBColorSpace *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428),
               (RGBColorSpace *)in_stack_fffffffffffff420);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6f8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff450);
      testing::AssertionResult::failure_message((AssertionResult *)0x5c4c89);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff450,
                 (Type)((ulong)in_stack_fffffffffffff448 >> 0x20),(char *)in_stack_fffffffffffff440,
                 (int)((ulong)in_stack_fffffffffffff438 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                 (Message *)CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff420);
      testing::Message::~Message((Message *)0x5c4cec);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c4d44);
    bVar1 = pbrt::Is8Bit(format_00);
    if (!bVar1) {
      local_780._100_4_ = pbrt::Image::Format(&local_680);
      testing::internal::EqHelper<false>::Compare<pbrt::PixelFormat,pbrt::PixelFormat>
                (in_stack_fffffffffffff438,
                 (char *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430),
                 (PixelFormat *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428),
                 (PixelFormat *)in_stack_fffffffffffff420);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_780 + 0x68))
      ;
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffff450);
        in_stack_fffffffffffff588 =
             (Tuple2<pbrt::Point2,_int>)
             testing::AssertionResult::failure_message((AssertionResult *)0x5c4e2a);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffff450,
                   (Type)((ulong)in_stack_fffffffffffff448 >> 0x20),
                   (char *)in_stack_fffffffffffff440,(int)((ulong)in_stack_fffffffffffff438 >> 0x20)
                   ,(char *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                   (Message *)CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff420);
        testing::Message::~Message((Message *)0x5c4e8d);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c4ee2);
    }
    desc = &local_680;
    local_7ec = 1;
    this_00 = (Image *)local_7e0;
    wrapMode_04.values = (WrapMode  [2])&local_7e9;
    local_7e8 = (Tuple2<pbrt::Point2,_int>)this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff460,(char *)in_stack_fffffffffffff458,in_stack_fffffffffffff450
              );
    in_stack_fffffffffffff560 = (Tuple2<pbrt::Point2,_int>)((long)local_7e0 + 0x20);
    local_7e8 = in_stack_fffffffffffff560;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff460,(char *)in_stack_fffffffffffff458,in_stack_fffffffffffff450
              );
    in_stack_fffffffffffff550 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_7e0 + 0x40);
    in_stack_fffffffffffff558 = &local_7eb;
    local_7e8 = (Tuple2<pbrt::Point2,_int>)in_stack_fffffffffffff550;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff460,(char *)in_stack_fffffffffffff458,in_stack_fffffffffffff450
              );
    local_7ec = 0;
    local_780._0_8_ = local_7e0;
    local_780._8_8_ = 3;
    v_01._M_array._4_4_ = in_stack_fffffffffffff42c;
    v_01._M_array._0_4_ = in_stack_fffffffffffff428;
    v_01._M_len._0_7_ = in_stack_fffffffffffff430;
    v_01._M_len._7_1_ = in_stack_fffffffffffff437;
    pstd::
    span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffff420,v_01);
    requestedChannels.n = in_stack_fffffffffffff508;
    requestedChannels.ptr = in_stack_fffffffffffff500;
    pbrt::Image::GetChannelDesc
              ((Image *)CONCAT44(in_stack_fffffffffffff4fc,in_stack_fffffffffffff4f8),
               requestedChannels);
    in_stack_fffffffffffff540 = (Image *)local_7e0;
    in_stack_fffffffffffff538 = (Image *)local_780;
    do {
      in_stack_fffffffffffff538 = (Image *)&in_stack_fffffffffffff538[-1].p32;
      std::__cxx11::string::~string((string *)in_stack_fffffffffffff538);
    } while (in_stack_fffffffffffff538 != in_stack_fffffffffffff540);
    in_stack_fffffffffffff548.memoryResource = (memory_resource *)in_stack_fffffffffffff538;
    std::allocator<char>::~allocator(&local_7eb);
    std::allocator<char>::~allocator(&local_7ea);
    std::allocator<char>::~allocator(&local_7e9);
    in_stack_fffffffffffff537 =
         pbrt::ImageChannelDesc::operator_cast_to_bool((ImageChannelDesc *)0x5c50df);
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)in_stack_fffffffffffff420,
               SUB81((ulong)in_stack_fffffffffffff418 >> 0x38,0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_800);
    in_stack_fffffffffffff536 = bVar1;
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff450);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498),
                 in_stack_fffffffffffff490,
                 (char *)CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488),
                 (char *)in_stack_fffffffffffff480);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff450,
                 (Type)((ulong)in_stack_fffffffffffff448 >> 0x20),(char *)in_stack_fffffffffffff440,
                 (int)((ulong)in_stack_fffffffffffff438 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                 (Message *)CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff420);
      std::__cxx11::string::~string(local_830);
      testing::Message::~Message((Message *)0x5c5347);
    }
    local_2c4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c53d8);
    if (local_2c4 == 0) {
      local_834 = 0;
      while (in_stack_fffffffffffff4fc = local_834,
            in_stack_fffffffffffff500 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,1),
            in_stack_fffffffffffff4fc < *(int *)in_stack_fffffffffffff500) {
        for (local_838 = 0; iVar7 = local_838,
            piVar4 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,0), iVar7 < *piVar4;
            local_838 = local_838 + 1) {
          pbrt::Point2<int>::Point2
                    ((Point2<int> *)in_stack_fffffffffffff420,
                     (int)((ulong)in_stack_fffffffffffff418 >> 0x20),(int)in_stack_fffffffffffff418)
          ;
          pbrt::WrapMode2D::WrapMode2D
                    ((WrapMode2D *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430),
                     in_stack_fffffffffffff42c);
          pbrt::Image::GetChannels
                    (this_00,(Point2i)in_stack_fffffffffffff588,(ImageChannelDesc *)desc,
                     (WrapMode2D)wrapMode_04.values);
          for (local_87c = 0; local_87c < 3; local_87c = local_87c + 1) {
            bVar1 = pbrt::Is8Bit(format_00);
            if (bVar1) {
              pbrt::Point2<int>::Point2
                        ((Point2<int> *)in_stack_fffffffffffff420,
                         (int)((ulong)in_stack_fffffffffffff418 >> 0x20),
                         (int)in_stack_fffffffffffff418);
              pbrt::WrapMode2D::WrapMode2D
                        ((WrapMode2D *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430)
                         ,in_stack_fffffffffffff42c);
              p_01.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff4b0;
              p_01.super_Tuple2<pbrt::Point2,_int>.x = (int)in_stack_fffffffffffff4ac;
              wrapMode_01.wrap.values[1] = (WrapMode)in_stack_fffffffffffff4a8;
              wrapMode_01.wrap.values[0] = in_stack_fffffffffffff4a4;
              ff = pbrt::Image::GetChannel
                             ((Image *)CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498)
                              ,p_01,(int)((ulong)in_stack_fffffffffffff490 >> 0x20),wrapMode_01);
              pbrt::Half::Half(&local_896,ff);
              local_894 = pbrt::Half::operator_cast_to_float(&local_896);
              pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                        ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                         in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
              testing::internal::EqHelper<false>::Compare<float,float>
                        (in_stack_fffffffffffff438,
                         (char *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430),
                         (float *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428),
                         (float *)in_stack_fffffffffffff420);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_890);
              if (!bVar1) {
                testing::Message::Message((Message *)in_stack_fffffffffffff450);
                testing::AssertionResult::failure_message((AssertionResult *)0x5c56b0);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)in_stack_fffffffffffff450,
                           (Type)((ulong)in_stack_fffffffffffff448 >> 0x20),
                           (char *)in_stack_fffffffffffff440,
                           (int)((ulong)in_stack_fffffffffffff438 >> 0x20),
                           (char *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)
                           CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                           (Message *)CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498))
                ;
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)in_stack_fffffffffffff420);
                testing::Message::~Message((Message *)0x5c5713);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c5768);
            }
            else {
              bVar1 = pbrt::Is16Bit(format_00);
              iVar7 = (int)((ulong)in_stack_fffffffffffff418 >> 0x20);
              if (bVar1) {
                pbrt::Point2<int>::Point2
                          ((Point2<int> *)in_stack_fffffffffffff420,iVar7,
                           (int)in_stack_fffffffffffff418);
                in_stack_fffffffffffff4b0 = local_87c;
                pbrt::WrapMode2D::WrapMode2D
                          ((WrapMode2D *)
                           CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430),
                           in_stack_fffffffffffff42c);
                p_02.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff4b0;
                p_02.super_Tuple2<pbrt::Point2,_int>.x = (int)in_stack_fffffffffffff4ac;
                wrapMode_02.wrap.values[1] = (WrapMode)in_stack_fffffffffffff4a8;
                wrapMode_02.wrap.values[0] = in_stack_fffffffffffff4a4;
                in_stack_fffffffffffff4ac =
                     pbrt::Image::GetChannel
                               ((Image *)CONCAT17(in_stack_fffffffffffff49f,
                                                  in_stack_fffffffffffff498),p_02,
                                (int)((ulong)in_stack_fffffffffffff490 >> 0x20),wrapMode_02);
                pbrt::Half::Half(&local_8ce,in_stack_fffffffffffff4ac);
                in_stack_fffffffffffff4a8 = pbrt::Half::operator_cast_to_float(&local_8ce);
                local_8cc = in_stack_fffffffffffff4a8;
                pvVar5 = pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                         operator[]((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                     *)in_stack_fffffffffffff420,
                                    (size_type)in_stack_fffffffffffff418);
                in_stack_fffffffffffff4a0 = SUB84(pvVar5,0);
                in_stack_fffffffffffff4a4 = (WrapMode)((ulong)pvVar5 >> 0x20);
                testing::internal::EqHelper<false>::Compare<float,float>
                          (in_stack_fffffffffffff438,
                           (char *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430),
                           (float *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428),
                           (float *)in_stack_fffffffffffff420);
                in_stack_fffffffffffff49f =
                     testing::AssertionResult::operator_cast_to_bool(local_8c8);
                if (!(bool)in_stack_fffffffffffff49f) {
                  testing::Message::Message((Message *)in_stack_fffffffffffff450);
                  in_stack_fffffffffffff490 =
                       testing::AssertionResult::failure_message((AssertionResult *)0x5c58fd);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)in_stack_fffffffffffff450,
                             (Type)((ulong)in_stack_fffffffffffff448 >> 0x20),
                             (char *)in_stack_fffffffffffff440,
                             (int)((ulong)in_stack_fffffffffffff438 >> 0x20),
                             (char *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)
                             CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                             (Message *)
                             CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498));
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)in_stack_fffffffffffff420);
                  testing::Message::~Message((Message *)0x5c595a);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c59af);
              }
              else {
                pbrt::Point2<int>::Point2
                          ((Point2<int> *)in_stack_fffffffffffff420,iVar7,
                           (int)in_stack_fffffffffffff418);
                in_stack_fffffffffffff48c = local_87c;
                pbrt::WrapMode2D::WrapMode2D
                          ((WrapMode2D *)
                           CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430),
                           in_stack_fffffffffffff42c);
                p_03.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff4b0;
                p_03.super_Tuple2<pbrt::Point2,_int>.x = (int)in_stack_fffffffffffff4ac;
                wrapMode_03.wrap.values[1] = (WrapMode)in_stack_fffffffffffff4a8;
                wrapMode_03.wrap.values[0] = in_stack_fffffffffffff4a4;
                in_stack_fffffffffffff488 =
                     pbrt::Image::GetChannel
                               ((Image *)CONCAT17(in_stack_fffffffffffff49f,
                                                  in_stack_fffffffffffff498),p_03,
                                (int)((ulong)in_stack_fffffffffffff490 >> 0x20),wrapMode_03);
                local_904 = in_stack_fffffffffffff488;
                in_stack_fffffffffffff480 =
                     pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                     operator[]((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *
                                )in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
                testing::internal::EqHelper<false>::Compare<float,float>
                          (in_stack_fffffffffffff438,
                           (char *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430),
                           (float *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428),
                           (float *)in_stack_fffffffffffff420);
                bVar1 = testing::AssertionResult::operator_cast_to_bool(local_900);
                if (!bVar1) {
                  testing::Message::Message((Message *)in_stack_fffffffffffff450);
                  testing::Message::operator<<
                            ((Message *)in_stack_fffffffffffff420,
                             (char (*) [5])in_stack_fffffffffffff418);
                  testing::Message::operator<<
                            ((Message *)in_stack_fffffffffffff420,(int *)in_stack_fffffffffffff418);
                  in_stack_fffffffffffff460 =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       testing::Message::operator<<
                                 ((Message *)in_stack_fffffffffffff420,
                                  (char (*) [3])in_stack_fffffffffffff418);
                  in_stack_fffffffffffff458 =
                       testing::Message::operator<<
                                 ((Message *)in_stack_fffffffffffff420,
                                  (int *)in_stack_fffffffffffff418);
                  in_stack_fffffffffffff450 =
                       (allocator<char> *)
                       testing::Message::operator<<
                                 ((Message *)in_stack_fffffffffffff420,
                                  (char (*) [6])in_stack_fffffffffffff418);
                  in_stack_fffffffffffff448 =
                       testing::Message::operator<<
                                 ((Message *)in_stack_fffffffffffff420,
                                  (int *)in_stack_fffffffffffff418);
                  in_stack_fffffffffffff440 =
                       testing::Message::operator<<
                                 ((Message *)in_stack_fffffffffffff420,
                                  (char (*) [2])in_stack_fffffffffffff418);
                  in_stack_fffffffffffff438 =
                       testing::AssertionResult::failure_message((AssertionResult *)0x5c5b85);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)in_stack_fffffffffffff450,
                             (Type)((ulong)in_stack_fffffffffffff448 >> 0x20),
                             (char *)in_stack_fffffffffffff440,
                             (int)((ulong)in_stack_fffffffffffff438 >> 0x20),
                             (char *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)
                             CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                             (Message *)
                             CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498));
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)in_stack_fffffffffffff420);
                  testing::Message::~Message((Message *)0x5c5bdf);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c5c34);
              }
            }
          }
          pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x5c5c6c);
        }
        local_834 = local_834 + 1;
      }
      remove("test.exr");
      testing::internal::EqHelper<true>::Compare<int,int>
                (in_stack_fffffffffffff438,
                 (char *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430),
                 (int *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428),
                 (int *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
      in_stack_fffffffffffff437 = testing::AssertionResult::operator_cast_to_bool(local_938);
      if (!(bool)in_stack_fffffffffffff437) {
        testing::Message::Message((Message *)in_stack_fffffffffffff450);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x5c5d53);
        in_stack_fffffffffffff428 = SUB84(pcVar6,0);
        in_stack_fffffffffffff42c = (WrapMode)((ulong)pcVar6 >> 0x20);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffff450,
                   (Type)((ulong)in_stack_fffffffffffff448 >> 0x20),
                   (char *)in_stack_fffffffffffff440,(int)((ulong)in_stack_fffffffffffff438 >> 0x20)
                   ,(char *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                   (Message *)CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff420);
        testing::Message::~Message((Message *)0x5c5db0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c5e05);
      local_2c4 = 0;
    }
    pbrt::ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x5c5e1d);
    pbrt::ImageAndMetadata::~ImageAndMetadata(in_stack_fffffffffffff420);
    pbrt::ImageMetadata::~ImageMetadata((ImageMetadata *)in_stack_fffffffffffff420);
LAB_005c5e37:
    pbrt::Image::~Image(&in_stack_fffffffffffff420->image);
    if (local_2c4 != 0) goto LAB_005c5eba;
  }
  local_2c4 = 0;
LAB_005c5eba:
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)in_stack_fffffffffffff420);
  return;
}

Assistant:

TEST(Image, ExrIO) {
    Point2i res(16, 49);
    pstd::vector<float> rgbPixels = GetFloatPixels(res, 3);

    for (auto format : {PixelFormat::U256, PixelFormat::Half, PixelFormat::Float}) {
        Image image(format, res, {"R", "G", "B"}, ColorEncodingHandle::Linear);
        image.CopyRectIn({{0, 0}, res}, rgbPixels);

        // Check CopyRectIn()
        int offset = 0;
        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x)
                for (int c = 0; c < 3; ++c, ++offset) {
                    if (format == PixelFormat::U256)
                        ;
                    else if (format == PixelFormat::Half)
                        ASSERT_EQ(Float(Half(rgbPixels[offset])),
                                  image.GetChannel({x, y}, c));
                    else if (format == PixelFormat::Float)
                        ASSERT_EQ(rgbPixels[offset], image.GetChannel({x, y}, c));
                }

        ImageMetadata metadata;
        metadata.colorSpace = RGBColorSpace::ACES2065_1;
        EXPECT_TRUE(image.Write("test.exr", metadata));

        ImageAndMetadata read = Image::Read("test.exr");

        EXPECT_EQ(image.Resolution(), read.image.Resolution());
        EXPECT_EQ(*RGBColorSpace::ACES2065_1, *read.metadata.GetColorSpace());
        if (!Is8Bit(format))
            EXPECT_EQ(read.image.Format(), format);

        ImageChannelDesc rgbDesc = read.image.GetChannelDesc({"R", "G", "B"});
        ASSERT_TRUE(bool(rgbDesc));

        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x) {
                ImageChannelValues v = read.image.GetChannels({x, y}, rgbDesc);
                for (int c = 0; c < 3; ++c)
                    if (Is8Bit(format))
                        EXPECT_EQ(Float(Half(image.GetChannel({x, y}, c))), v[c]);
                    else if (Is16Bit(format))
                        EXPECT_EQ(Float(Half(image.GetChannel({x, y}, c))), v[c]);
                    else
                        EXPECT_EQ(image.GetChannel({x, y}, c), v[c])
                            << " @ (" << x << ", " << y << ", ch " << c << ")";
            }

        EXPECT_EQ(0, remove("test.exr"));
    }
}